

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdySparseMAPSolver.cpp
# Opt level: O3

void __thiscall
iDynTree::BerdySparseMAPSolver::BerdySparseMAPSolverPimpl::BerdySparseMAPSolverPimpl
          (BerdySparseMAPSolverPimpl *this,BerdyHelper *berdyHelper)

{
  this->berdy = berdyHelper;
  this->valid = false;
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&this->priorDynamicsRegularizationExpectedValue);
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::SparseMatrix();
  iDynTree::VectorDynSize::VectorDynSize(&this->dynamicsConstraintsBias);
  iDynTree::VectorDynSize::VectorDynSize(&this->measurementsBias);
  iDynTree::JointPosDoubleArray::JointPosDoubleArray(&this->jointsConfiguration,0);
  iDynTree::JointDOFsDoubleArray::JointDOFsDoubleArray(&this->jointsVelocity,0);
  iDynTree::VectorDynSize::VectorDynSize(&this->measurements);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsPrior);
  (this->covarianceDynamicsPriorInverse).
  super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue = false;
  (this->covarianceDynamicsPriorInverse).m_outerSize = -1;
  (this->covarianceDynamicsPriorInverse).m_innerSize = 0;
  (this->covarianceDynamicsPriorInverse).m_outerIndex = (StorageIndex *)0x0;
  (this->covarianceDynamicsPriorInverse).m_innerNonZeros = (StorageIndex *)0x0;
  (this->covarianceDynamicsPriorInverse).m_data.m_values = (Scalar *)0x0;
  (this->covarianceDynamicsPriorInverse).m_data.m_indices = (StorageIndex *)0x0;
  (this->covarianceDynamicsPriorInverse).m_data.m_size = 0;
  (this->covarianceDynamicsPriorInverse).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&this->covarianceDynamicsPriorInverse,0,0);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsPriorRHS);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsAPosteriori);
  (this->covarianceDynamicsAPosterioriInverse).
  super_SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>.
  super_SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>.m_isRValue = false;
  (this->covarianceDynamicsAPosterioriInverse).m_outerSize = -1;
  (this->covarianceDynamicsAPosterioriInverse).m_innerSize = 0;
  (this->covarianceDynamicsAPosterioriInverse).m_outerIndex = (StorageIndex *)0x0;
  (this->covarianceDynamicsAPosterioriInverse).m_innerNonZeros = (StorageIndex *)0x0;
  (this->covarianceDynamicsAPosterioriInverse).m_data.m_values = (Scalar *)0x0;
  (this->covarianceDynamicsAPosterioriInverse).m_data.m_indices = (StorageIndex *)0x0;
  (this->covarianceDynamicsAPosterioriInverse).m_data.m_size = 0;
  (this->covarianceDynamicsAPosterioriInverse).m_data.m_allocatedSize = 0;
  Eigen::SparseMatrix<double,_0,_int>::resize(&this->covarianceDynamicsAPosterioriInverse,0,0);
  iDynTree::VectorDynSize::VectorDynSize(&this->expectedDynamicsAPosterioriRHS);
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::SimplicialCholeskyBase
            (&(this->covarianceDynamicsPriorInverseDecomposition).
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            );
  Eigen::
  SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
  ::SimplicialCholeskyBase
            (&(this->covarianceDynamicsAPosterioriInverseDecomposition).
              super_SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
            );
  initialize(this);
  return;
}

Assistant:

BerdySparseMAPSolverPimpl(BerdyHelper& berdyHelper)
        : berdy(berdyHelper)
        , valid(false)
        {
            initialize();
        }